

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O1

void doTest(int w,int h,int *formats,int nformats,int subsamp,char *basename)

{
  int iVar1;
  uint subsamp_00;
  unsigned_long __size;
  uchar *__ptr;
  uint uVar2;
  int iVar3;
  long lVar4;
  tjhandle pvVar5;
  uchar *buf;
  FILE *__s;
  int *piVar6;
  undefined8 uVar7;
  char cVar8;
  ulong uVar9;
  int iVar10;
  void *pvVar11;
  uint uVar12;
  char *pcVar13;
  char *__format;
  undefined4 in_register_00000084;
  char *basename_00;
  ulong uVar14;
  undefined1 *puVar15;
  char cVar16;
  undefined1 *puVar17;
  long lVar18;
  size_t sVar19;
  bool bVar20;
  int in_stack_fffffffffffffb18;
  unsigned_long size;
  uchar *dstBuf;
  ulong local_4b8;
  void *local_4b0;
  ulong local_4a8;
  uchar *local_4a0;
  long local_498;
  ulong local_490;
  tjhandle local_488;
  char *local_480;
  long local_478;
  ulong local_470;
  ulong local_468;
  long local_460;
  char *local_458;
  long local_450;
  int *local_448;
  char *local_440;
  char local_438 [1032];
  
  basename_00 = (char *)CONCAT44(in_register_00000084,subsamp);
  dstBuf = (uchar *)0x0;
  size = 0;
  local_458 = basename;
  local_448 = formats;
  if (alloc == 0) {
    size = tjBufSize(w,h,basename_00);
  }
  if ((size == 0) || (dstBuf = (uchar *)tjAlloc(), dstBuf != (uchar *)0x0)) {
    lVar4 = tjInitCompress();
    if ((lVar4 == 0) || (pvVar5 = (tjhandle)tjInitDecompress(), pvVar5 == (tjhandle)0x0)) {
      uVar7 = tjGetErrorStr();
      pvVar5 = (tjhandle)0x0;
      printf("TurboJPEG ERROR:\n%s\n",uVar7);
      exitStatus = -1;
    }
    else {
      local_498 = lVar4;
      local_488 = pvVar5;
      if (0 < nformats) {
        uVar9 = (ulong)(uint)w;
        local_4a8 = (ulong)(uint)subsamp;
        local_468 = (ulong)(uint)nformats;
        local_470 = (ulong)(subsamp - 1);
        local_450 = (long)(h * w);
        local_490 = 0;
        do {
          uVar14 = 0;
          do {
            uVar2 = 0;
            if ((uint)local_470 < 5) {
              uVar2 = *(uint *)(&DAT_001068c8 + local_470 * 4);
            }
            subsamp_00 = uVar2 | 2;
            if ((int)uVar14 != 1) {
              subsamp_00 = uVar2;
            }
            bVar20 = (subsamp_00 & 2) == 0;
            local_4a0 = "Bottom-Up";
            if (bVar20) {
              local_4a0 = "Top-Down ";
            }
            iVar3 = local_448[local_490];
            lVar4 = (long)iVar3;
            local_440 = "BU";
            if (bVar20) {
              local_440 = "TD";
            }
            local_480 = pixFormatStr[lVar4];
            lVar18 = (long)tjPixelSize[lVar4];
            sVar19 = local_450 * lVar18;
            local_4b0 = malloc(sVar19);
            local_478 = lVar4;
            if (local_4b0 == (void *)0x0) {
              printf("ERROR: %s\n","Memory allocation failure");
LAB_001030c8:
              exitStatus = -1;
              buf = (uchar *)0x0;
              iVar3 = (int)uVar14;
            }
            else {
              local_4b8 = uVar14;
              if (iVar3 == 0xb) {
                memset(local_4b0,0xff,sVar19);
                if (0 < h) {
                  uVar2 = 0;
                  do {
                    if (0 < w) {
                      uVar12 = ~uVar2 + h;
                      if ((subsamp_00 & 2) == 0) {
                        uVar12 = uVar2;
                      }
                      puVar15 = (undefined1 *)((long)local_4b0 + lVar18 * (int)(uVar12 * w) + 3);
                      uVar14 = 0;
                      do {
                        if ((((uint)(uVar14 >> 3) & 0x1fffffff) + (uVar2 >> 3) & 1) == 0) {
                          puVar17 = puVar15;
                          if (0xf < uVar2) {
LAB_00103160:
                            *puVar17 = 0;
                          }
                        }
                        else {
                          puVar15[-1] = 0;
                          if (uVar2 < 0x10) {
                            puVar17 = (undefined1 *)
                                      ((long)local_4b0 +
                                      (uVar14 + (long)(int)(uVar12 * w)) * lVar18 + 1);
                            goto LAB_00103160;
                          }
                        }
                        uVar14 = uVar14 + 1;
                        puVar15 = puVar15 + lVar18;
                      } while (uVar9 != uVar14);
                    }
                    uVar2 = uVar2 + 1;
                  } while (uVar2 != h);
                }
              }
              else if (iVar3 == 6) {
                memset(local_4b0,0,sVar19);
                if (0 < h) {
                  uVar2 = 0;
                  do {
                    if (0 < w) {
                      uVar12 = ~uVar2 + h;
                      if ((subsamp_00 & 2) == 0) {
                        uVar12 = uVar2;
                      }
                      cVar8 = -0x1e;
                      if (uVar2 < 0x10) {
                        cVar8 = 'L';
                      }
                      uVar14 = 0;
                      do {
                        cVar16 = -(uVar2 < 0x10);
                        if ((((uint)(uVar14 >> 3) & 0x1fffffff) + (uVar2 >> 3) & 1) != 0) {
                          cVar16 = cVar8;
                        }
                        *(char *)((long)local_4b0 + uVar14 + (long)(int)(uVar12 * w)) = cVar16;
                        uVar14 = uVar14 + 1;
                      } while (uVar9 != uVar14);
                    }
                    uVar2 = uVar2 + 1;
                  } while (uVar2 != h);
                }
              }
              else {
                iVar3 = tjRedOffset[lVar4];
                iVar10 = tjGreenOffset[lVar4];
                iVar1 = tjBlueOffset[lVar4];
                memset(local_4b0,0,sVar19);
                if (0 < h) {
                  uVar2 = 0;
                  do {
                    if (0 < w) {
                      uVar12 = ~uVar2 + h;
                      if ((subsamp_00 & 2) == 0) {
                        uVar12 = uVar2;
                      }
                      pvVar11 = (void *)(lVar18 * (int)(uVar12 * w) + (long)local_4b0);
                      uVar14 = 0;
                      do {
                        if ((((uint)(uVar14 >> 3) & 0x1fffffff) + (uVar2 >> 3) & 1) == 0) {
                          if (uVar2 < 0x10) {
                            *(undefined1 *)((long)pvVar11 + (long)iVar3) = 0xff;
                            *(undefined1 *)((long)pvVar11 + (long)iVar10) = 0xff;
                            puVar15 = (undefined1 *)((long)pvVar11 + (long)iVar1);
LAB_0010322d:
                            *puVar15 = 0xff;
                          }
                        }
                        else {
                          *(undefined1 *)((long)pvVar11 + (long)iVar3) = 0xff;
                          if (0xf < uVar2) {
                            puVar15 = (undefined1 *)
                                      ((long)local_4b0 +
                                      (long)iVar10 + (uVar14 + (long)(int)(uVar12 * w)) * lVar18);
                            goto LAB_0010322d;
                          }
                        }
                        uVar14 = uVar14 + 1;
                        pvVar11 = (void *)((long)pvVar11 + lVar18);
                      } while (uVar9 != uVar14);
                    }
                    uVar2 = uVar2 + 1;
                  } while (uVar2 != h);
                }
              }
              if ((dstBuf != (uchar *)0x0) && (size != 0)) {
                memset(dstBuf,0,size);
              }
              uVar14 = local_4a8;
              uVar2 = subsamp_00 | 0x400;
              if (alloc != 0) {
                uVar2 = subsamp_00;
              }
              if (doYUV == 0) {
                printf("%s %s -> %s Q%d ... ",local_480,local_4a0,subNameLong[local_4a8],100);
                iVar3 = tjCompress2(local_498,local_4b0,w,0,h,local_478,&dstBuf,&size,basename_00,
                                    100,uVar2);
                if (iVar3 == -1) {
                  uVar7 = tjGetErrorStr();
                  printf("TurboJPEG ERROR:\n%s\n",uVar7);
                  uVar14 = local_4b8;
                  goto LAB_001030c8;
                }
                buf = (uchar *)0x0;
                iVar3 = (int)local_4b8;
                uVar14 = local_4a8;
              }
              else {
                sVar19 = tjBufSizeYUV2(w,pad,h);
                lVar4 = tjInitCompress();
                if (lVar4 == 0) {
                  pcVar13 = (char *)tjGetErrorStr();
                  __format = "TurboJPEG ERROR:\n%s\n";
LAB_001034ad:
                  printf(__format,pcVar13);
                  buf = (uchar *)0x0;
                  iVar3 = (int)local_4b8;
LAB_001034c5:
                  exitStatus = -1;
                  bVar20 = false;
                }
                else {
                  buf = (uchar *)malloc(sVar19);
                  if (buf == (uchar *)0x0) {
                    __format = "ERROR: %s\n";
                    pcVar13 = "Memory allocation failure";
                    goto LAB_001034ad;
                  }
                  memset(buf,0,sVar19);
                  printf("%s %s -> YUV %s ... ",local_480,local_4a0);
                  local_460 = lVar4;
                  iVar3 = tjEncodeYUV3(lVar4,local_4b0,w,0,h,local_478,buf,pad,basename_00,uVar2);
                  if (iVar3 == -1) {
                    uVar7 = tjGetErrorStr();
                    printf("TurboJPEG ERROR:\n%s\n",uVar7);
                    iVar3 = (int)local_4b8;
                    uVar14 = local_4a8;
                    goto LAB_001034c5;
                  }
                  tjDestroy(local_460);
                  iVar3 = checkBufYUV(buf,w,h,subsamp,(tjscalingfactor)0x100000001);
                  pcVar13 = "Passed.";
                  if (iVar3 == 0) {
                    pcVar13 = "FAILED!";
                  }
                  puts(pcVar13);
                  printf("YUV %s %s -> JPEG Q%d ... ",subNameLong[local_4a8],local_4a0,100);
                  local_4a0 = buf;
                  iVar3 = tjCompressFromYUV(local_498,buf,w,pad,h,subsamp,&dstBuf,&size,100,uVar2);
                  bVar20 = true;
                  if (iVar3 == -1) {
                    uVar7 = tjGetErrorStr();
                    printf("TurboJPEG ERROR:\n%s\n",uVar7);
                    iVar3 = (int)local_4b8;
                    uVar14 = local_4a8;
                    buf = local_4a0;
                    goto LAB_001034c5;
                  }
                  iVar3 = (int)local_4b8;
                  uVar14 = local_4a8;
                  buf = local_4a0;
                }
                if (!bVar20) goto LAB_001035bb;
              }
              snprintf(local_438,0x400,"%s_enc_%s_%s_%s_Q%d.jpg",local_458,local_480,local_440,
                       subName[uVar14],100);
              __ptr = dstBuf;
              __size = size;
              __s = fopen(local_438,"wb");
              if ((__s == (FILE *)0x0) || (sVar19 = fwrite(__ptr,__size,1,__s), sVar19 != 1)) {
                piVar6 = __errno_location();
                pcVar13 = strerror(*piVar6);
                printf("ERROR: Could not write to %s.\n%s\n",local_438,pcVar13);
                exitStatus = -1;
              }
              if (__s != (FILE *)0x0) {
                fclose(__s);
              }
              printf("Done.\n  Result in %s\n",local_438);
            }
LAB_001035bb:
            free(buf);
            free(local_4b0);
            iVar10 = (int)local_478;
            decompTest(local_488,dstBuf,size,w,h,iVar10,basename_00,subsamp_00,
                       in_stack_fffffffffffffb18);
            if (iVar10 - 2U < 4) {
              putchar(10);
              decompTest(local_488,dstBuf,size,w,h,iVar10 + 5,basename_00,subsamp_00,
                         in_stack_fffffffffffffb18);
            }
            putchar(10);
            uVar14 = (ulong)(iVar3 + 1);
          } while (iVar3 == 0);
          local_490 = local_490 + 1;
        } while (local_490 != local_468);
      }
      puts("--------------------\n");
      lVar4 = local_498;
      pvVar5 = local_488;
    }
  }
  else {
    pvVar5 = (tjhandle)0x0;
    printf("ERROR: %s\n","Memory allocation failure.");
    exitStatus = -1;
    lVar4 = 0;
  }
  if (lVar4 != 0) {
    tjDestroy(lVar4);
  }
  if (pvVar5 != (tjhandle)0x0) {
    tjDestroy(pvVar5);
  }
  tjFree(dstBuf);
  return;
}

Assistant:

static void doTest(int w, int h, const int *formats, int nformats, int subsamp,
                   char *basename)
{
  tjhandle chandle = NULL, dhandle = NULL;
  unsigned char *dstBuf = NULL;
  unsigned long size = 0;
  int pfi, pf, i;

  if (!alloc)
    size = tjBufSize(w, h, subsamp);
  if (size != 0)
    if ((dstBuf = (unsigned char *)tjAlloc(size)) == NULL)
      THROW("Memory allocation failure.");

  if ((chandle = tjInitCompress()) == NULL ||
      (dhandle = tjInitDecompress()) == NULL)
    THROW_TJ();

  for (pfi = 0; pfi < nformats; pfi++) {
    for (i = 0; i < 2; i++) {
      int flags = 0;

      if (subsamp == TJSAMP_422 || subsamp == TJSAMP_420 ||
          subsamp == TJSAMP_440 || subsamp == TJSAMP_411)
        flags |= TJFLAG_FASTUPSAMPLE;
      if (i == 1) flags |= TJFLAG_BOTTOMUP;
      pf = formats[pfi];
      compTest(chandle, &dstBuf, &size, w, h, pf, basename, subsamp, 100,
               flags);
      decompTest(dhandle, dstBuf, size, w, h, pf, basename, subsamp, flags);
      if (pf >= TJPF_RGBX && pf <= TJPF_XRGB) {
        printf("\n");
        decompTest(dhandle, dstBuf, size, w, h, pf + (TJPF_RGBA - TJPF_RGBX),
                   basename, subsamp, flags);
      }
      printf("\n");
    }
  }
  printf("--------------------\n\n");

bailout:
  if (chandle) tjDestroy(chandle);
  if (dhandle) tjDestroy(dhandle);
  tjFree(dstBuf);
}